

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O2

void __thiscall
Symbol_table::define_name(Symbol_table *this,string *name,double value,bool is_const)

{
  bool bVar1;
  allocator<char> local_79;
  double local_78;
  Variable local_70;
  string local_40;
  
  local_78 = value;
  bVar1 = is_declared(this,name);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"redeclaration of variable",&local_79);
    error(&local_70.name);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  Variable::Variable(&local_70,&local_40,local_78,is_const);
  std::vector<Variable,_std::allocator<Variable>_>::emplace_back<Variable>
            ((vector<Variable,_std::allocator<Variable>_> *)this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Symbol_table::define_name(const string& name, double value, bool is_const = false)
{
	if (is_declared(name))
		error("redeclaration of variable");
	var_table.push_back(Variable(name, value, is_const));
}